

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O2

optional<unsigned_long> tools::xar::read_sysfs_cgroup_inode(char *filename)

{
  int iVar1;
  ulong uVar2;
  size_t in_RCX;
  char *in_RDX;
  long lVar3;
  ssize_t in_R9;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar4;
  string_view s;
  undefined1 local_171;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  char *local_158 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> contents;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  maybe_contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat st;
  
  (anonymous_namespace)::read_file_prefix_abi_cxx11_
            (&maybe_contents,(_anonymous_namespace_ *)filename,in_RDX,in_RCX);
  if (maybe_contents.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__cxx11::string::string((string *)&contents,(string *)&maybe_contents);
    if (contents._M_string_length == 0x1000) {
      uVar2 = 0;
    }
    else {
      st.st_dev._0_1_ = 0x3a;
      s._M_str = (char *)0xffffffffffffffff;
      s._M_len = (size_t)contents._M_dataplus._M_p;
      split<char>(&components,(xar *)&st,(char *)contents._M_string_length,s,in_R9);
      if (0x40 < (ulong)((long)components.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)components.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        uVar2 = std::__cxx11::string::find
                          ((char)components.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + '@',10);
        if (uVar2 != 0xffffffffffffffff) {
          std::__cxx11::string::erase
                    ((ulong)(components.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2),uVar2);
        }
        local_158[0] = "/sys/fs/cgroup";
        local_158[1] = "/cgroup2";
        unaff_R14._M_value = (unsigned_long)&local_171;
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,*(char **)((long)local_158 + lVar3),
                     (allocator<char> *)unaff_R14);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                         &local_e0,"/");
          std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &st,
                         components.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
          std::__cxx11::string::~string((string *)&st);
          std::__cxx11::string::~string((string *)&local_e0);
          iVar1 = stat(path._M_dataplus._M_p,(stat *)&st);
          if (iVar1 == 0) {
            std::__cxx11::string::~string((string *)&path);
            uVar2 = CONCAT71((int7)((ulong)&local_e0 >> 8),1);
            unaff_R14 = (_Storage<unsigned_long,_true>)st.st_ino;
            goto LAB_00107414;
          }
          std::__cxx11::string::~string((string *)&path);
        }
      }
      uVar2 = 0;
LAB_00107414:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&components);
    }
    std::__cxx11::string::~string((string *)&contents);
  }
  else {
    uVar2 = 0;
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&maybe_contents);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2 & 0xffffffff;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<ino_t> read_sysfs_cgroup_inode(const char* filename) {
  const auto maybe_contents = read_file_prefix(filename, 4096);
  if (!maybe_contents) {
    return std::nullopt;
  }
  const auto contents = *maybe_contents;
  if (contents.size() == 4096) {
    return std::nullopt;
  }

  // File contents are a colon-separated triplet.  We want the last
  // field, and to toss out the trailing newline.
  auto components = tools::xar::split(':', contents);
  if (components.size() < 3) {
    return std::nullopt;
  }
  auto newline_pos = components[2].find('\n');
  if (newline_pos != std::string::npos) {
    components[2].erase(newline_pos);
  }

  // /sys/fs/cgroup is the typical mount point for the cgroup2
  // filesystem, but it is not guaranteed.  In some FB environments
  // we've historically used /cgroup2 instead.
  for (auto& candidate : {"/sys/fs/cgroup", "/cgroup2"}) {
    auto path = std::string(candidate) + "/" + components[2];
    struct stat st;
    if (stat(path.c_str(), &st) == 0) {
      return st.st_ino;
    }
  }

  return std::nullopt;
}